

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_annotation.c
# Opt level: O1

HPDF_Annotation
HPDF_3DAnnot_New(HPDF_MMgr mmgr,HPDF_Xref_conflict xref,HPDF_Rect rect,HPDF_BOOL tb,HPDF_BOOL np,
                HPDF_U3D u3d,HPDF_Image ap)

{
  HPDF_Annotation dict;
  HPDF_String obj;
  HPDF_Dict p_Var1;
  HPDF_STATUS HVar2;
  HPDF_STATUS HVar3;
  HPDF_STATUS HVar4;
  HPDF_STATUS HVar5;
  HPDF_STATUS HVar6;
  
  dict = HPDF_Annotation_New(mmgr,xref,HPDF_ANNOT_3D,rect);
  if (dict != (HPDF_Annotation)0x0) {
    HPDF_Dict_AddNumber(dict,"F",0x44);
    obj = HPDF_String_New(mmgr,"3D Model",(HPDF_Encoder_conflict)0x0);
    HPDF_Dict_Add(dict,"Contents",obj);
    p_Var1 = HPDF_Dict_New(mmgr);
    if (p_Var1 == (HPDF_Dict)0x0) {
      return (HPDF_Annotation)0x0;
    }
    HVar2 = HPDF_Dict_Add(dict,"3DA",p_Var1);
    if (HVar2 == 0) {
      HVar2 = HPDF_Dict_AddName(p_Var1,"A","PO");
      HVar3 = HPDF_Dict_AddBoolean(p_Var1,"TB",tb);
      HVar4 = HPDF_Dict_AddBoolean(p_Var1,"NP",np);
      HVar5 = HPDF_Dict_AddName(p_Var1,"DIS","U");
      HVar6 = HPDF_Dict_AddName(p_Var1,"AIS","L");
      if ((((HVar6 + HVar5 + HVar4 + HVar3 + HVar2 == 0) &&
           (HVar2 = HPDF_Dict_Add(dict,"3DD",u3d), HVar2 == 0)) &&
          (p_Var1 = HPDF_Dict_New(mmgr), p_Var1 != (HPDF_Dict)0x0)) &&
         ((HVar2 = HPDF_Dict_Add(dict,"AP",p_Var1), HVar2 == 0 &&
          ((ap != (HPDF_Image)0x0 || (ap = HPDF_Dict_New(mmgr), ap != (HPDF_Dict)0x0)))))) {
        HVar2 = HPDF_Dict_Add(p_Var1,"N",ap);
        if (HVar2 != 0) {
          return (HPDF_Annotation)0x0;
        }
        return dict;
      }
    }
  }
  return (HPDF_Annotation)0x0;
}

Assistant:

HPDF_Annotation
HPDF_3DAnnot_New    (HPDF_MMgr        mmgr,
                     HPDF_Xref        xref,
                     HPDF_Rect        rect,
                     HPDF_BOOL        tb,
                     HPDF_BOOL        np,
                     HPDF_U3D         u3d,
                     HPDF_Image       ap)
{
    HPDF_Annotation annot;
    HPDF_Dict action, appearance, stream;
    HPDF_STATUS ret;

    HPDF_PTRACE((" HPDF_3DAnnot_New\n"));

    annot = HPDF_Annotation_New (mmgr, xref, HPDF_ANNOT_3D, rect);
    if (!annot) {
        return NULL;
    }

    // include the flags
    HPDF_Dict_AddNumber (annot, "F", 68);
    //Bit 3:Print If set, print the annotation when the page is printed.
    //Bit 7:If set, do not allow the annotation to interact with the user.
    //      The annotation may be displayed or printed (depending on the settings of the NoView and Print flags)
    //      but should not respond to mouse clicks or change its appearance in response to mouse motions.

    HPDF_Dict_Add(annot, "Contents", HPDF_String_New (mmgr, "3D Model", NULL));

    action = HPDF_Dict_New (mmgr);
    if (!action) {
        return NULL;
    }

    ret = HPDF_Dict_Add (annot, "3DA", action);
    if (ret != HPDF_OK) {
        return NULL;
    }

    // enable visibility on page open
    ret += HPDF_Dict_AddName (action, "A", "PO");

    // enable visibility of ToolBar
    ret += HPDF_Dict_AddBoolean(action, "TB", tb);

    // enable visibility of Navigation Panel
    ret += HPDF_Dict_AddBoolean(action, "NP", np);

    // Set behavior of Annotation on Disabling
    ret += HPDF_Dict_AddName(action, "DIS", "U");

    // Set behavior of Annotation upon activation
    ret += HPDF_Dict_AddName(action, "AIS", "L");

    if (ret != HPDF_OK) {
        return NULL;
    }

    if (HPDF_Dict_Add (annot, "3DD", u3d) != HPDF_OK) {
        return NULL;
    }

    appearance = HPDF_Dict_New (mmgr);
    if (!appearance) {
        return NULL;
    }

    ret = HPDF_Dict_Add (annot, "AP", appearance);
    if (ret != HPDF_OK) {
        return NULL;
    }

    if (ap) {
        if (HPDF_Dict_Add (appearance, "N", ap) != HPDF_OK)
            return NULL;
    }
    else {
        stream = HPDF_Dict_New (mmgr);
        if (!stream) {
            return NULL;
        }
        ret = HPDF_Dict_Add (appearance, "N", stream);
    }

    if (ret != HPDF_OK) {
        return NULL;
    }

    return annot;
}